

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool __thiscall ELFIO::elfio::load_segments(elfio *this,istream *stream)

{
  segment *psVar1;
  bool bVar2;
  Elf_Half EVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  endianess_convertor *seg_begin;
  long lVar7;
  endianess_convertor *seg_end;
  segment_impl<ELFIO::Elf64_Phdr> *seg_begin_00;
  section *psVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  elfio *in_RDI;
  section *psec;
  Elf_Half j;
  Elf64_Off segVEndAddr;
  Elf64_Off segVBaseAddr;
  Elf64_Off segEndOffset;
  Elf64_Off segBaseOffset;
  uchar file_class;
  segment *seg;
  Elf_Half i;
  Elf64_Off offset;
  Elf_Half num;
  Elf_Half entry_size;
  long *in_stack_ffffffffffffff18;
  fpos<__mbstate_t> *in_stack_ffffffffffffff20;
  value_type *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  endianess_convertor *in_stack_ffffffffffffff48;
  segment_impl<ELFIO::Elf64_Phdr> *in_stack_ffffffffffffff50;
  ushort local_82;
  undefined8 local_60;
  undefined8 local_58;
  long *local_38;
  ushort local_2a;
  
  (*in_RDI->header->_vptr_elf_header[9])();
  iVar4 = (*in_RDI->header->_vptr_elf_header[0x1c])();
  (*in_RDI->header->_vptr_elf_header[0x1e])();
  local_2a = 0;
  do {
    if ((ushort)iVar4 <= local_2a) {
      return true;
    }
    iVar5 = (*in_RDI->header->_vptr_elf_header[4])();
    if ((char)iVar5 == '\x02') {
      local_38 = (long *)operator_new(0x80);
      segment_impl<ELFIO::Elf64_Phdr>::segment_impl
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    else {
      if ((char)iVar5 != '\x01') {
        return false;
      }
      local_38 = (long *)operator_new(0x68);
      segment_impl<ELFIO::Elf32_Phdr>::segment_impl
                ((segment_impl<ELFIO::Elf32_Phdr> *)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff48);
    }
    std::fpos<__mbstate_t>::fpos(in_stack_ffffffffffffff20,(streamoff)in_stack_ffffffffffffff18);
    (**(code **)(*local_38 + 0xd0))(local_38,in_RSI,local_60,local_58);
    (**(code **)(*local_38 + 0xc0))(local_38,local_2a,extraout_RDX,local_2a);
    seg_begin = (endianess_convertor *)(**(code **)(*local_38 + 0x88))();
    in_stack_ffffffffffffff48 = seg_begin;
    lVar7 = (**(code **)(*local_38 + 0x68))();
    seg_end = in_stack_ffffffffffffff48 + lVar7;
    seg_begin_00 = (segment_impl<ELFIO::Elf64_Phdr> *)(**(code **)(*local_38 + 0x48))();
    in_stack_ffffffffffffff50 = seg_begin_00;
    lVar7 = (**(code **)(*local_38 + 0x78))();
    psVar1 = &in_stack_ffffffffffffff50->super_segment;
    local_82 = 0;
    while( true ) {
      uVar6 = (uint)local_82;
      EVar3 = Sections::size((Sections *)0x10b801);
      if ((int)(uint)EVar3 <= (int)uVar6) break;
      psVar8 = Sections::operator[]
                         ((Sections *)CONCAT44(uVar6,in_stack_ffffffffffffff30),
                          (uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      uVar6 = (*psVar8->_vptr_section[7])();
      if ((uVar6 & 2) == 0) {
        iVar5 = (*psVar8->_vptr_section[0x17])();
        in_stack_ffffffffffffff20 = (fpos<__mbstate_t> *)CONCAT44(extraout_var_01,iVar5);
        iVar5 = (*psVar8->_vptr_section[0x13])();
        bVar2 = is_sect_in_seg(in_RDI,(Elf64_Off)in_stack_ffffffffffffff20,
                               CONCAT44(extraout_var_02,iVar5),(Elf64_Off)seg_begin,
                               (Elf64_Off)seg_end);
        if (bVar2) goto LAB_0010b8c5;
      }
      else {
        iVar5 = (*psVar8->_vptr_section[0x11])();
        in_stack_ffffffffffffff28 = (value_type *)CONCAT44(extraout_var,iVar5);
        iVar5 = (*psVar8->_vptr_section[0x13])();
        bVar2 = is_sect_in_seg(in_RDI,(Elf64_Off)in_stack_ffffffffffffff28,
                               CONCAT44(extraout_var_00,iVar5),(Elf64_Off)seg_begin_00,
                               (long)&psVar1->_vptr_segment + lVar7);
        if (bVar2) {
LAB_0010b8c5:
          in_stack_ffffffffffffff18 = local_38;
          iVar5 = (*psVar8->_vptr_section[2])();
          (**(code **)(*in_stack_ffffffffffffff18 + 0x98))
                    (in_stack_ffffffffffffff18,(short)iVar5,0,(short)iVar5);
        }
      }
      local_82 = local_82 + 1;
    }
    std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::push_back
              ((vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)
               CONCAT44(uVar6,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28);
    local_2a = local_2a + 1;
  } while( true );
}

Assistant:

bool load_segments( std::istream& stream )
    {
        Elf_Half  entry_size = header->get_segment_entry_size();
        Elf_Half  num        = header->get_segments_num();
        Elf64_Off offset     = header->get_segments_offset();

        for ( Elf_Half i = 0; i < num; ++i ) {
            segment* seg;
            unsigned char file_class = header->get_class();

            if ( file_class == ELFCLASS64 ) {
                seg = new segment_impl<Elf64_Phdr>( &convertor );
            }
            else if ( file_class == ELFCLASS32 ) {
                seg = new segment_impl<Elf32_Phdr>( &convertor );
            }
            else {
                return false;
            }

            seg->load( stream, (std::streamoff)offset + i * entry_size );
            seg->set_index( i );

            // Add sections to the segments (similar to readelfs algorithm)
            Elf64_Off segBaseOffset = seg->get_offset();
            Elf64_Off segEndOffset  = segBaseOffset + seg->get_file_size();
            Elf64_Off segVBaseAddr = seg->get_virtual_address();
            Elf64_Off segVEndAddr  = segVBaseAddr + seg->get_memory_size();
            for( Elf_Half j = 0; j < sections.size(); ++j ) {
                const section* psec = sections[j];

                // SHF_ALLOC sections are matched based on the virtual address
                // otherwise the file offset is matched
                if( psec->get_flags() & SHF_ALLOC
                      ? is_sect_in_seg( psec->get_address(), psec->get_size(), segVBaseAddr,  segVEndAddr )
                      : is_sect_in_seg( psec->get_offset(),  psec->get_size(), segBaseOffset, segEndOffset )) {
                      // Alignment of segment shall not be updated, to preserve original value
                      // It will be re-calculated on saving.
                      seg->add_section_index( psec->get_index(), 0 );
                }
            }

            // Add section into the segments' container
            segments_.push_back( seg );
        }

        return true;
    }